

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ircbot.cpp
# Opt level: O2

bool __thiscall ircBot::IsCommand(ircBot *this,char *buff)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char *p;
  
  bVar2 = checkping(this,buff);
  bVar3 = true;
  if (!bVar2) {
    ParseMessage(this,buff);
    cVar1 = (this->msg).message[0];
    if ((cVar1 == '@') || (cVar1 == '#')) {
      p = (this->msg).message + 1;
      conoutf("%s",p);
      execute(p);
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool ircBot::IsCommand(char *buff)
{
    if(!checkping(buff))
    {
        ParseMessage(buff);
        if(msg.message[0] == '#' || msg.message[0] == '@')
        {
            char *c = msg.message;
            c++;
            conoutf("%s", c); //<-- silenced warning, old: conoutf(c);
            execute(c);
            return true;
        }return false;
    }return true;
}